

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor FVar1;
  long lVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  int iVar5;
  FieldGenerator *pFVar6;
  LogMessage *pLVar7;
  Descriptor *pDVar8;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  FieldGeneratorMap *this_01;
  char *pcVar9;
  size_type in_R9;
  FieldDescriptor *pFVar10;
  StringPiece has_bits_var;
  Formatter format;
  Iterator __begin3_1;
  Iterator __end3;
  Iterator __begin3;
  Iterator __end3_2;
  Formatter local_140;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 local_f0 [48];
  Descriptor *local_c0;
  undefined1 local_b8 [8];
  _Rb_tree_node_base local_b0;
  size_t local_90;
  Printer *local_88;
  FieldGeneratorMap *local_80;
  Iterator local_78;
  Formatter local_68;
  
  local_140.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_140.vars_._M_t,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\x01') {
    Formatter::operator()<>
              (&local_140,
               "$classname$::$classname$() {}\n$classname$::$classname$(::$proto_ns$::Arena* arena)\n    : SuperType(arena) {}\nvoid $classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n"
              );
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_,
                           (bool *)0x0);
    if (FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) {
      pcVar9 = 
      "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
      ;
      if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\0') {
        pcVar9 = 
        "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
        ;
      }
      Formatter::operator()(&local_140,pcVar9,&this->index_in_file_messages_);
    }
  }
  else {
    options = &this->options_;
    bVar3 = IsAnyMessage(this->descriptor_,options);
    if (bVar3) {
      FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),options,(bool *)0x0);
      if (FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) {
        Formatter::operator()<>
                  (&local_140,
                   "bool $classname$::GetAnyFieldDescriptors(\n    const ::$proto_ns$::Message& message,\n    const ::$proto_ns$::FieldDescriptor** type_url_field,\n    const ::$proto_ns$::FieldDescriptor** value_field) {\n  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n      message, type_url_field, value_field);\n}\n"
                  );
      }
      Formatter::operator()<>
                (&local_140,
                 "bool $classname$::ParseAnyTypeUrl(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n    std::string* full_type_name) {\n  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n                                             full_type_name);\n}\n\n"
                );
    }
    Formatter::operator()<>(&local_140,"class $classname$::_Internal {\n public:\n");
    io::Printer::Indent(local_140.printer_);
    if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>
                (&local_140,"using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
    }
    local_c0 = this->descriptor_;
    local_b8._0_4_ = 0;
    local_f0._40_4_ = *(undefined4 *)(local_c0 + 4);
    this_01 = &this->field_generators_;
    local_b0._0_8_ = local_c0;
    local_88 = printer;
    local_80 = this_01;
    while (bVar3 = operator==((Iterator *)local_b8,(Iterator *)(local_f0 + 0x28)), !bVar3) {
      pFVar10 = (FieldDescriptor *)
                ((long)(int)local_b8._0_4_ * 0x48 + *(long *)(local_b0._0_8_ + 0x28));
      pFVar6 = FieldGeneratorMap::get(this_01,pFVar10);
      (*pFVar6->_vptr_FieldGenerator[9])(pFVar6,printer);
      FVar1 = pFVar10[1];
      if (((byte)FVar1 & 2) == 0) {
        if ((((byte)FVar1 & 0x60) == 0x20) &&
           (*(char *)(*(long *)(pFVar10 + 0x10) + 0x3a) == '\x02')) {
          if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(pFVar10 + 0x28) == 0)) goto LAB_002a3d72;
        }
        else if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002a3d72;
      }
      else {
LAB_002a3d72:
        if (*(char *)(*(long *)(pFVar10 + 0x38) + 0x4f) == '\0') {
          iVar5 = HasBitIndex(this,pFVar10);
          field = extraout_RDX;
          if (iVar5 == -1) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x943);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)local_100,
                                "CHECK failed: (has_bit_index) != (kNoHasbit): ");
            pLVar7 = internal::LogMessage::operator<<
                               (pLVar7,(string *)(*(long *)(pFVar10 + 8) + 0x20));
            internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)local_100);
            field = extraout_RDX_00;
          }
          FieldName_abi_cxx11_((string *)local_100,(cpp *)pFVar10,field);
          local_78.idx = iVar5 + 0x1f;
          if (-1 < iVar5) {
            local_78.idx = iVar5;
          }
          local_78.idx = local_78.idx >> 5;
          local_104 = 1 << ((byte)iVar5 & 0x1f);
          Formatter::operator()
                    (&local_140,
                     "static void set_has_$1$(HasBits* has_bits) {\n  (*has_bits)[$2$] |= $3$u;\n}\n"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100
                     ,&local_78.idx,&local_104);
          this_01 = local_80;
          printer = local_88;
          if ((Formatter *)local_100._0_8_ != (Formatter *)local_f0) {
            operator_delete((void *)local_100._0_8_);
            this_01 = local_80;
            printer = local_88;
          }
        }
      }
      local_b8._0_4_ = local_b8._0_4_ + 1;
    }
    if (0 < this->num_required_fields_) {
      RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,this);
      has_bits_var.length_ = in_R9;
      has_bits_var.ptr_ = (char *)0x8;
      (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                ((string *)local_100,(_anonymous_namespace_ *)local_b8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,true,has_bits_var);
      Formatter::operator()
                (&local_140,
                 "static bool MissingRequiredFields(const HasBits& has_bits) {\n  return $1$;\n}\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
      if ((Formatter *)local_100._0_8_ != (Formatter *)local_f0) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((void *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
      }
    }
    io::Printer::Outdent(local_140.printer_);
    Formatter::operator()<>(&local_140,"};\n\n");
    local_100._8_8_ = this->descriptor_;
    local_100._0_8_ = (ulong)(uint)local_100._4_4_ << 0x20;
    local_b8._0_4_ = *(undefined4 *)(local_100._8_8_ + 4);
    local_b0._0_8_ = local_100._8_8_;
    while (bVar3 = operator==((Iterator *)local_100,(Iterator *)local_b8), !bVar3) {
      pFVar6 = FieldGeneratorMap::get
                         (this_01,(FieldDescriptor *)
                                  ((long)(int)local_100._0_4_ * 0x48 +
                                  *(long *)(local_100._8_8_ + 0x28)));
      (*pFVar6->_vptr_FieldGenerator[8])(pFVar6,printer);
      local_100._0_4_ = local_100._0_4_ + LOGLEVEL_WARNING;
    }
    local_c0 = this->descriptor_;
    local_f0._40_4_ = 0;
    local_78.idx = *(int *)(local_c0 + 4);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_100 + 8);
    local_78.descriptor = local_c0;
    while (bVar3 = operator==((Iterator *)(local_f0 + 0x28),&local_78), !bVar3) {
      pFVar10 = (FieldDescriptor *)((long)(int)local_f0._40_4_ * 0x48 + *(long *)(local_c0 + 0x28));
      pFVar6 = FieldGeneratorMap::get(this_01,pFVar10);
      (*pFVar6->_vptr_FieldGenerator[7])(pFVar6,printer);
      bVar3 = anon_unknown_0::IsCrossFileMaybeMap(pFVar10);
      if (bVar3) {
        local_100._0_8_ = &local_140;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(this_00,&local_140.vars_._M_t);
        local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
        local_b0._M_parent = (_Base_ptr)0x0;
        local_b0._M_left = &local_b0;
        local_90 = 0;
        local_b0._M_right = local_b0._M_left;
        SetCommonFieldVariables
                  (pFVar10,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_b8,options);
        lVar2 = *(long *)(pFVar10 + 0x28);
        if ((lVar2 != 0 && ((byte)pFVar10[1] & 0x10) != 0) &&
           ((*(int *)(lVar2 + 4) != 1 || ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) == 0)))) {
          SetCommonOneofFieldVariables
                    (pFVar10,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_b8);
        }
        Formatter::AddMap(&local_140,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_b8);
        local_68.printer_ = local_140.printer_;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_68.vars_._M_t,&local_140.vars_._M_t);
        GenerateFieldClear(this,pFVar10,false,&local_68);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_68.vars_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_b8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_100._0_8_ + 8),this_00);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(this_00);
      }
      local_f0._40_4_ = local_f0._40_4_ + 1;
    }
    GenerateStructors(this,printer);
    Formatter::operator()<>(&local_140,"\n");
    pDVar8 = this->descriptor_;
    if (0 < *(int *)(pDVar8 + 0x6c)) {
      GenerateOneofClear(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      pDVar8 = this->descriptor_;
    }
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(pDVar8 + 0x10),options,(bool *)0x0);
    if (FVar4 != FileOptions_OptimizeMode_CODE_SIZE) {
      GenerateClear(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      pDVar8 = this->descriptor_;
      FVar4 = GetOptimizeFor(*(FileDescriptor **)(pDVar8 + 0x10),options,(bool *)0x0);
      if (((FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar8 + 0x78) != 0)) ||
         (*(int *)(pDVar8 + 4) != 0)) {
        ParseFunctionGenerator::GenerateMethodImpls
                  ((this->parse_function_generator_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                   ._M_head_impl,printer);
        Formatter::operator()<>(&local_140,"\n");
        ParseFunctionGenerator::GenerateDataDefinitions
                  ((this->parse_function_generator_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      GenerateSerializeWithCachedSizesToArray(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      GenerateByteSize(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      GenerateMergeFrom(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      GenerateClassSpecificMergeFrom(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      GenerateCopyFrom(this,printer);
      Formatter::operator()<>(&local_140,"\n");
      GenerateIsInitialized(this,printer);
      Formatter::operator()<>(&local_140,"\n");
    }
    GenerateSwap(this,printer);
    Formatter::operator()<>(&local_140,"\n");
    if ((this->options_).table_driven_serialization == true) {
      Formatter::operator()
                (&local_140,
                 "const void* $classname$::InternalGetTable() const {\n  return ::$tablename$::serialization_table + $1$;\n}\n\n"
                 ,&this->index_in_file_messages_);
    }
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),options,(bool *)0x0);
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      Formatter::operator()<>
                (&local_140,
                 "std::string $classname$::GetTypeName() const {\n  return \"$full_name$\";\n}\n\n")
      ;
      pDVar8 = extraout_RDX_01;
    }
    else {
      pcVar9 = 
      "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
      ;
      if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\0') {
        pcVar9 = 
        "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
        ;
      }
      Formatter::operator()(&local_140,pcVar9,&this->index_in_file_messages_);
      pDVar8 = extraout_RDX_02;
    }
    if (((this->options_).field_listener_options.inject_field_listener_events == true) &&
       (*(int *)(*(long *)(*(long *)((cpp *)this->descriptor_ + 0x10) + 0x78) + 0xa0) != 3)) {
      ClassName_abi_cxx11_((string *)local_100,(cpp *)this->descriptor_,pDVar8);
      Formatter::operator()
                (&local_140,
                 "::$proto_ns$::AccessListener<$classtype$> $1$::_tracker_(&FullMessageName);\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
      if ((Formatter *)local_100._0_8_ != (Formatter *)local_f0) {
        operator_delete((void *)local_100._0_8_);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_140.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (IsMapEntryMessage(descriptor_)) {
    format(
        "$classname$::$classname$() {}\n"
        "$classname$::$classname$(::$proto_ns$::Arena* arena)\n"
        "    : SuperType(arena) {}\n"
        "void $classname$::MergeFrom(const $classname$& other) {\n"
        "  MergeFromInternal(other);\n"
        "}\n");
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      if (!descriptor_->options().map_entry()) {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "$annotate_reflection$"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      } else {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      }
    }
    return;
  }

  if (IsAnyMessage(descriptor_, options_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      format(
          "bool $classname$::GetAnyFieldDescriptors(\n"
          "    const ::$proto_ns$::Message& message,\n"
          "    const ::$proto_ns$::FieldDescriptor** type_url_field,\n"
          "    const ::$proto_ns$::FieldDescriptor** value_field) {\n"
          "  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n"
          "      message, type_url_field, value_field);\n"
          "}\n");
    }
    format(
        "bool $classname$::ParseAnyTypeUrl(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n"
        "    std::string* full_type_name) {\n"
        "  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n"
        "                                             full_type_name);\n"
        "}\n"
        "\n");
  }

  format(
      "class $classname$::_Internal {\n"
      " public:\n");
  format.Indent();
  if (!has_bit_indices_.empty()) {
    format(
        "using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
  }
  for (auto field : FieldRange(descriptor_)) {
    field_generators_.get(field).GenerateInternalAccessorDeclarations(printer);
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      GOOGLE_CHECK_NE(has_bit_index, kNoHasbit) << field->full_name();
      format(
          "static void set_has_$1$(HasBits* has_bits) {\n"
          "  (*has_bits)[$2$] |= $3$u;\n"
          "}\n",
          FieldName(field), has_bit_index / 32, (1u << (has_bit_index % 32)));
    }
  }
  if (num_required_fields_ > 0) {
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format(
        "static bool MissingRequiredFields(const HasBits& has_bits) "
        "{\n"
        "  return $1$;\n"
        "}\n",
        ConditionalToCheckBitmasks(masks_for_has_bits, false, "has_bits"));
  }

  format.Outdent();
  format("};\n\n");
  for (auto field : FieldRange(descriptor_)) {
    if (!IsFieldStripped(field, options_)) {
      field_generators_.get(field).GenerateInternalAccessorDefinitions(printer);
    }
  }

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(printer);
    if (IsCrossFileMaybeMap(field)) {
      Formatter::SaveState saver(&format);
      std::map<std::string, std::string> vars;
      SetCommonFieldVariables(field, &vars, options_);
      if (field->real_containing_oneof()) {
        SetCommonOneofFieldVariables(field, &vars);
      }
      format.AddMap(vars);
      GenerateFieldClear(field, false, format);
    }
  }

  GenerateStructors(printer);
  format("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    format("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    format("\n");

    if (!HasSimpleBaseClass(descriptor_, options_)) {
      parse_function_generator_->GenerateMethodImpls(printer);
      format("\n");

      parse_function_generator_->GenerateDataDefinitions(printer);
    }

    GenerateSerializeWithCachedSizesToArray(printer);
    format("\n");

    GenerateByteSize(printer);
    format("\n");

    GenerateMergeFrom(printer);
    format("\n");

    GenerateClassSpecificMergeFrom(printer);
    format("\n");

    GenerateCopyFrom(printer);
    format("\n");

    GenerateIsInitialized(printer);
    format("\n");
  }

  GenerateVerify(printer);

  GenerateSwap(printer);
  format("\n");

  if (options_.table_driven_serialization) {
    format(
        "const void* $classname$::InternalGetTable() const {\n"
        "  return ::$tablename$::serialization_table + $1$;\n"
        "}\n"
        "\n",
        index_in_file_messages_);
  }
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    if (!descriptor_->options().map_entry()) {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "$annotate_reflection$"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    } else {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    }
  } else {
    format(
        "std::string $classname$::GetTypeName() const {\n"
        "  return \"$full_name$\";\n"
        "}\n"
        "\n");
  }

  if (options_.field_listener_options.inject_field_listener_events &&
      descriptor_->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    format(
        "::$proto_ns$::AccessListener<$classtype$> "
        "$1$::_tracker_(&FullMessageName);\n",
        ClassName(descriptor_));
  }
}